

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int RGBColorTable(uint8_t *dst_argb,int dst_stride_argb,uint8_t *table_argb,int dst_x,int dst_y,
                 int width,int height)

{
  int iVar1;
  long lVar2;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  uint8_t *dst;
  _func_void_uint8_t_ptr_uint8_t_ptr_int *RGBColorTableRow;
  int y;
  code *local_38;
  int local_30;
  int local_2c;
  int local_14;
  int local_4;
  
  local_38 = RGBColorTableRow_C;
  lVar2 = in_RDI + in_R8D * in_ESI + (long)(in_ECX << 2);
  if ((((in_RDI == 0) || (in_RDX == 0)) || (in_R9D < 1)) ||
     ((((int)dst < 1 || (in_ECX < 0)) || (in_R8D < 0)))) {
    local_4 = -1;
  }
  else {
    local_2c = in_R9D;
    local_14 = in_ESI;
    if (in_ESI == in_R9D << 2) {
      local_2c = (int)dst * in_R9D;
      dst._0_4_ = 1;
      local_14 = 0;
    }
    iVar1 = libyuv::TestCpuFlag((int)((ulong)lVar2 >> 0x20));
    if (iVar1 != 0) {
      local_38 = RGBColorTableRow_X86;
    }
    for (local_30 = 0; local_30 < (int)dst; local_30 = local_30 + 1) {
      (*local_38)(lVar2,in_RDX,local_2c);
      lVar2 = lVar2 + local_14;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int RGBColorTable(uint8_t* dst_argb,
                  int dst_stride_argb,
                  const uint8_t* table_argb,
                  int dst_x,
                  int dst_y,
                  int width,
                  int height) {
  int y;
  void (*RGBColorTableRow)(uint8_t * dst_argb, const uint8_t* table_argb,
                           int width) = RGBColorTableRow_C;
  uint8_t* dst = dst_argb + dst_y * dst_stride_argb + dst_x * 4;
  if (!dst_argb || !table_argb || width <= 0 || height <= 0 || dst_x < 0 ||
      dst_y < 0) {
    return -1;
  }
  // Coalesce rows.
  if (dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    dst_stride_argb = 0;
  }
#if defined(HAS_RGBCOLORTABLEROW_X86)
  if (TestCpuFlag(kCpuHasX86)) {
    RGBColorTableRow = RGBColorTableRow_X86;
  }
#endif
  for (y = 0; y < height; ++y) {
    RGBColorTableRow(dst, table_argb, width);
    dst += dst_stride_argb;
  }
  return 0;
}